

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::Compiler::Node_&> __thiscall
capnp::compiler::Compiler::Impl::lookupBuiltin(Impl *this,StringPtr name)

{
  bool bVar1;
  pointer ppVar2;
  RefOrVoid<capnp::compiler::Compiler::Node> t;
  _Base_ptr p_Var3;
  _Self local_38;
  _Self local_30;
  iterator iter;
  Impl *this_local;
  StringPtr name_local;
  
  this_local = (Impl *)name.content.size_;
  p_Var3 = (_Base_ptr)name.content.ptr;
  iter._M_node = p_Var3;
  name_local.content.size_ = (size_t)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
       ::find(p_Var3 + 0x11,(key_type *)&this_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
       ::end(p_Var3 + 0x11);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    kj::Maybe<capnp::compiler::Compiler::Node_&>::Maybe
              ((Maybe<capnp::compiler::Compiler::Node_&> *)this);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>
             ::operator->(&local_30);
    t = kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::operator*(&ppVar2->second);
    kj::Maybe<capnp::compiler::Compiler::Node_&>::Maybe
              ((Maybe<capnp::compiler::Compiler::Node_&> *)this,t);
  }
  return (Maybe<capnp::compiler::Compiler::Node_&>)(Node *)this;
}

Assistant:

kj::Maybe<Compiler::Node&> Compiler::Impl::lookupBuiltin(kj::StringPtr name) {
  auto iter = builtinDecls.find(name);
  if (iter == builtinDecls.end()) {
    return kj::none;
  } else {
    return *iter->second;
  }
}